

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layered_toon_shader.cpp
# Opt level: O0

void vec3_layer(float *r,float *maxr,float max_n,float n)

{
  float local_30;
  float local_2c;
  float i;
  vec3 cadd;
  float n_local;
  float max_n_local;
  float *maxr_local;
  float *r_local;
  
  *r = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;
  cadd[1] = n;
  cadd[2] = max_n;
  vec3_scale(&local_2c,maxr,1.0 / max_n);
  for (local_30 = 0.0; local_30 < cadd[1]; local_30 = local_30 + 1.0) {
    vec3_add(r,r,&local_2c);
  }
  return;
}

Assistant:

void vec3_layer(vec3 r, const vec3 maxr, const float max_n, const float n){
    //set to lowest layer color
    r[0] = 0.0f;
    r[1] = 0.0f;
    r[2] = 0.0f;

    //a color add for each layer
    vec3 cadd;
    vec3_scale(cadd, maxr, 1/max_n);

    //cal current layer color
    for(float i=0.0f; i<n; i+=1.0f){
        vec3_add(r, r, cadd);
    }
}